

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool adios2sys::SystemTools::Split
               (string *str,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *lines)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  string *in_RDI;
  size_type rpos;
  size_type lpos;
  string data;
  value_type *in_stack_ffffffffffffff18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff20;
  string local_b8 [32];
  string local_98 [32];
  undefined4 local_78;
  string local_68 [32];
  ulong local_48;
  ulong local_40;
  string local_38 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::__cxx11::string::string(local_38,in_RDI);
  local_40 = 0;
  do {
    uVar1 = local_40;
    uVar2 = std::__cxx11::string::length();
    if (uVar2 <= uVar1) {
      local_1 = 1;
LAB_00f3c01d:
      local_78 = 1;
      std::__cxx11::string::~string(local_38);
      return (bool)(local_1 & 1);
    }
    local_48 = std::__cxx11::string::find_first_of((char)local_38,10);
    if (local_48 == 0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)local_68,(ulong)local_38);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      std::__cxx11::string::~string(local_68);
      local_1 = 0;
      goto LAB_00f3c01d;
    }
    if (local_40 < local_48) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
      if (*pcVar3 != '\r') goto LAB_00f3bf89;
      std::__cxx11::string::substr((ulong)local_98,(ulong)local_38);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      std::__cxx11::string::~string(local_98);
    }
    else {
LAB_00f3bf89:
      in_stack_ffffffffffffff20 = local_18;
      std::__cxx11::string::substr((ulong)local_b8,(ulong)local_38);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      std::__cxx11::string::~string(local_b8);
    }
    local_40 = local_48 + 1;
  } while( true );
}

Assistant:

bool SystemTools::Split(const std::string& str,
                        std::vector<std::string>& lines)
{
  std::string data(str);
  std::string::size_type lpos = 0;
  while (lpos < data.length()) {
    std::string::size_type rpos = data.find_first_of('\n', lpos);
    if (rpos == std::string::npos) {
      // Line ends at end of string without a newline.
      lines.push_back(data.substr(lpos));
      return false;
    }
    if ((rpos > lpos) && (data[rpos - 1] == '\r')) {
      // Line ends in a "\r\n" pair, remove both characters.
      lines.push_back(data.substr(lpos, (rpos - 1) - lpos));
    } else {
      // Line ends in a "\n", remove the character.
      lines.push_back(data.substr(lpos, rpos - lpos));
    }
    lpos = rpos + 1;
  }
  return true;
}